

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

int Imf_3_4::getScanlineChunkOffsetTableSize(Header *header)

{
  int iVar1;
  Box2i *pBVar2;
  int64_t lineOffsetSize;
  int64_t linesInBuffer;
  Box2i *dataWindow;
  
  pBVar2 = Header::dataWindow((Header *)0x206a23);
  Header::compression((Header *)0x206a32);
  iVar1 = numLinesInBuffer((Compression)((ulong)pBVar2 >> 0x20));
  return (int)((((long)(pBVar2->max).y - (long)(pBVar2->min).y) + (long)iVar1) / (long)iVar1);
}

Assistant:

int
getScanlineChunkOffsetTableSize (const Header& header)
{
    const Box2i& dataWindow = header.dataWindow ();

    //
    // use int64_t types to prevent overflow in lineOffsetSize for images with
    // extremely high dataWindows
    //
    int64_t linesInBuffer = numLinesInBuffer (header.compression ());

    int64_t lineOffsetSize =
        (static_cast<int64_t> (dataWindow.max.y) -
         static_cast<int64_t> (dataWindow.min.y) + linesInBuffer) /
        linesInBuffer;

    return static_cast<int> (lineOffsetSize);
}